

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O0

void display_options_item
               (menu_conflict *menu,wchar_t oid,_Bool cursor,wchar_t row,wchar_t col,wchar_t width)

{
  _Bool _Var1;
  ulong uVar2;
  uint8_t attr_1;
  uint8_t attr;
  _Bool known;
  size_t line;
  wchar_t width_local;
  wchar_t col_local;
  wchar_t row_local;
  _Bool cursor_local;
  wchar_t oid_local;
  menu_conflict *menu_local;
  
  uVar2 = (ulong)oid;
  if (uVar2 < 0xf) {
    _Var1 = seen_tval(sval_dependent[uVar2].tval);
    c_prt(curs_attrs[(int)(uint)_Var1][(int)(uint)cursor],sval_dependent[uVar2].desc,row,col);
  }
  else if (uVar2 - 0x10 < 3) {
    c_prt(curs_attrs[1][(int)(uint)cursor],extra_item_options[uVar2 - 0x10].name,row,col);
  }
  return;
}

Assistant:

static void display_options_item(struct menu *menu, int oid, bool cursor,
								 int row, int col, int width)
{
	size_t line = (size_t) oid;

	/* Most of the menu is svals, with a small "extra options" section below */
	if (line < N_ELEMENTS(sval_dependent)) {
		bool known = seen_tval(sval_dependent[line].tval);
		uint8_t attr = curs_attrs[known ? CURS_KNOWN: CURS_UNKNOWN][(int)cursor];

		c_prt(attr, sval_dependent[line].desc, row, col);
	} else {
		uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];

		line = line - N_ELEMENTS(sval_dependent) - 1;

		if (line < N_ELEMENTS(extra_item_options))
			c_prt(attr, extra_item_options[line].name, row, col);
	}
}